

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O2

void Cmd_soundlinks(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 0x38;
  uVar1 = S_sfx.Count;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    uVar2 = (ulong)*(uint *)((long)&((S_sfx.Array)->data).data + lVar4);
    if ((uVar2 != 0xffffffff) && ((*(byte *)((long)S_sfx.Array + lVar4 + -8) & 3) == 0)) {
      Printf("%s -> %s\n",*(undefined8 *)((long)S_sfx.Array + lVar4 + -0x28),
             S_sfx.Array[uVar2].name.Chars);
      uVar1 = S_sfx.Count;
    }
    lVar4 = lVar4 + 0x50;
  }
  return;
}

Assistant:

CCMD (soundlinks)
{
	unsigned int i;

	for (i = 0; i < S_sfx.Size (); i++)
	{
		const sfxinfo_t *sfx = &S_sfx[i];

		if (sfx->link != sfxinfo_t::NO_LINK &&
			!sfx->bRandomHeader &&
			!sfx->bPlayerReserve)
		{
			Printf ("%s -> %s\n", sfx->name.GetChars(), S_sfx[sfx->link].name.GetChars());
		}
	}
}